

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::Variable::display(Variable *this,ostream *o)

{
  ostream *poVar1;
  SharedTyPtr SVar2;
  Displayable local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  (**(((this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_Displayable)._vptr_Displayable)();
  if (this->is_memory_var == true) {
    poVar1 = std::operator<<(o," memory (");
    SVar2 = type((Variable *)&local_30);
    (**(code **)*local_30._vptr_Displayable)
              (local_30._vptr_Displayable,poVar1,
               SVar2.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::operator<<(poVar1,")");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  if (this->is_temp_var == true) {
    std::operator<<(o," temp");
  }
  poVar1 = std::operator<<(o,", priority: ");
  std::ostream::operator<<(poVar1,this->priority);
  return;
}

Assistant:

void Variable::display(std::ostream& o) const {
  o << *ty;
  if (is_memory_var) {
    o << " memory (" << *(type()) << ")";
  }
  if (is_temp_var) {
    o << " temp";
  }
  o << ", priority: " << priority;
}